

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O1

void __thiscall
boost::object_pool<test_handler_class,_boost::default_user_allocator_new_delete>::~object_pool
          (object_pool<test_handler_class,_boost::default_user_allocator_new_delete> *this)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  size_type sVar5;
  ulong uVar6;
  char *pcVar7;
  
  pcVar4 = (this->super_pool<boost::default_user_allocator_new_delete>).list.ptr;
  if (pcVar4 != (char *)0x0) {
    uVar1 = (this->super_pool<boost::default_user_allocator_new_delete>).requested_size;
    uVar6 = 8;
    if (8 < uVar1) {
      uVar6 = uVar1;
    }
    if (uVar6 + 7 < 8) {
      __assert_fail("s >= min_alloc_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/pool/pool.hpp"
                    ,0x161,
                    "size_type boost::pool<>::alloc_size() const [UserAllocator = boost::default_user_allocator_new_delete]"
                   );
    }
    pcVar7 = (char *)(this->super_pool<boost::default_user_allocator_new_delete>).
                     super_simple_segregated_storage<unsigned_long>.first;
    sVar5 = (this->super_pool<boost::default_user_allocator_new_delete>).list.sz;
    do {
      if (pcVar4 != pcVar4 + (sVar5 - 0x10)) {
        lVar3 = 0;
        do {
          if (pcVar4 + lVar3 == pcVar7) {
            pcVar7 = *(char **)pcVar7;
          }
          lVar3 = lVar3 + (uVar6 + 7 & 0xfffffffffffffff8);
        } while (sVar5 - 0x10 != lVar3);
      }
      pcVar2 = *(char **)(pcVar4 + (sVar5 - 0x10));
      sVar5 = *(size_type *)(pcVar4 + (sVar5 - 8));
      operator_delete__(pcVar4);
      pcVar4 = pcVar2;
    } while (pcVar2 != (char *)0x0);
    (this->super_pool<boost::default_user_allocator_new_delete>).list.ptr = (char *)0x0;
  }
  pool<boost::default_user_allocator_new_delete>::purge_memory
            (&this->super_pool<boost::default_user_allocator_new_delete>);
  return;
}

Assistant:

object_pool<T, UserAllocator>::~object_pool()
{
#ifndef BOOST_POOL_VALGRIND
  // handle trivial case of invalid list.
  if (!this->list.valid())
    return;

  details::PODptr<size_type> iter = this->list;
  details::PODptr<size_type> next = iter;

  // Start 'freed_iter' at beginning of free list
  void * freed_iter = this->first;

  const size_type partition_size = this->alloc_size();

  do
  {
    // increment next
    next = next.next();

    // delete all contained objects that aren't freed.

    // Iterate 'i' through all chunks in the memory block.
    for (char * i = iter.begin(); i != iter.end(); i += partition_size)
    {
      // If this chunk is free,
      if (i == freed_iter)
      {
        // Increment freed_iter to point to next in free list.
        freed_iter = nextof(freed_iter);

        // Continue searching chunks in the memory block.
        continue;
      }

      // This chunk is not free (allocated), so call its destructor,
      static_cast<T *>(static_cast<void *>(i))->~T();
      // and continue searching chunks in the memory block.
    }

    // free storage.
    (UserAllocator::free)(iter.begin());

    // increment iter.
    iter = next;
  } while (iter.valid());

  // Make the block list empty so that the inherited destructor doesn't try to
  // free it again.
  this->list.invalidate();
#else
   // destruct all used elements:
   for(std::set<void*>::iterator pos = this->used_list.begin(); pos != this->used_list.end(); ++pos)
   {
      static_cast<T*>(*pos)->~T();
   }
   // base class will actually free the memory...
#endif
}